

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O2

int EmitAlphaYUV(VP8Io *io,WebPDecParams *p,int expected_num_lines_out)

{
  int w;
  int h;
  WebPDecBuffer *pWVar1;
  uint8_t *puVar2;
  int iVar3;
  uint8_t *__src;
  uint8_t *dst;
  bool bVar4;
  
  __src = io->a;
  pWVar1 = p->output;
  w = io->mb_w;
  h = io->mb_h;
  puVar2 = (pWVar1->u).YUVA.a;
  iVar3 = (pWVar1->u).YUVA.a_stride;
  dst = puVar2 + (long)io->mb_y * (long)iVar3;
  if (__src == (uint8_t *)0x0) {
    if (puVar2 != (uint8_t *)0x0) {
      FillAlphaPlane(dst,w,h,iVar3);
    }
  }
  else {
    iVar3 = 0;
    if (0 < h) {
      iVar3 = h;
    }
    while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
      memcpy(dst,__src,(long)w);
      __src = __src + io->width;
      dst = dst + (pWVar1->u).YUVA.a_stride;
    }
  }
  return 0;
}

Assistant:

static int EmitAlphaYUV(const VP8Io* const io, WebPDecParams* const p,
                        int expected_num_lines_out) {
  const uint8_t* alpha = io->a;
  const WebPYUVABuffer* const buf = &p->output->u.YUVA;
  const int mb_w = io->mb_w;
  const int mb_h = io->mb_h;
  uint8_t* dst = buf->a + (size_t)io->mb_y * buf->a_stride;
  int j;
  (void)expected_num_lines_out;
  assert(expected_num_lines_out == mb_h);
  if (alpha != NULL) {
    for (j = 0; j < mb_h; ++j) {
      memcpy(dst, alpha, mb_w * sizeof(*dst));
      alpha += io->width;
      dst += buf->a_stride;
    }
  } else if (buf->a != NULL) {
    // the user requested alpha, but there is none, set it to opaque.
    FillAlphaPlane(dst, mb_w, mb_h, buf->a_stride);
  }
  return 0;
}